

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

void __thiscall ADPlanner::Recomputegval(ADPlanner *this,ADState *state)

{
  DiscreteSpaceInformation *pDVar1;
  long lVar2;
  vector<int,_std::allocator<int>_> searchpredsIDV;
  vector<int,_std::allocator<int>_> costV;
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  lVar2 = 0x28;
  if (this->bforwardsearch != false) {
    lVar2 = 0x58;
  }
  (**(code **)((long)pDVar1->_vptr_DiscreteSpaceInformation + lVar2))
            (pDVar1,**(undefined4 **)(state + 0x18));
  *(undefined4 *)(state + 0x24) = 1000000000;
  return;
}

Assistant:

void ADPlanner::Recomputegval(ADState* state)
{
    vector<int> searchpredsIDV; //these are predecessors if search is done forward and successors otherwise
    vector<int> costV;
    CKey key;
    ADState *searchpredstate;

    if (bforwardsearch)
        environment_->GetPreds(state->MDPstate->StateID, &searchpredsIDV, &costV);
    else
        environment_->GetSuccs(state->MDPstate->StateID, &searchpredsIDV, &costV);

    //iterate through predecessors of s and pick the best
    state->g = INFINITECOST;
    for (int pind = 0; pind < (int)searchpredsIDV.size(); pind++) {
        //skip the states that do not exist - they can not be used to improve g-value anyway
        if (environment_->StateID2IndexMapping[searchpredsIDV[pind]][ADMDP_STATEID2IND] == -1) continue;

        CMDPSTATE* predMDPState = GetState(searchpredsIDV[pind], pSearchStateSpace_);
        int cost = costV[pind];
        searchpredstate = (ADState*)(predMDPState->PlannerSpecificData);

        //see if it can be used to improve
        if (searchpredstate->callnumberaccessed == pSearchStateSpace_->callnumber && state->g > searchpredstate->v
            + cost) {
            if (bforwardsearch) {
                state->g = searchpredstate->v + cost;
                state->bestpredstate = predMDPState;
            }
            else {
                state->g = searchpredstate->v + cost;
                state->bestnextstate = predMDPState;
                state->costtobestnextstate = cost;
            }
        }
    } //over preds
}